

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jieba.cc
# Opt level: O2

void jieba_word_weight_free(jieba_word_weight_t *wws)

{
  jieba_word_weight_t *pjVar1;
  
  for (pjVar1 = wws; (pjVar1 != (jieba_word_weight_t *)0x0 && (pjVar1->word != (char *)0x0));
      pjVar1 = pjVar1 + 1) {
    free(pjVar1->word);
    pjVar1->word = (char *)0x0;
  }
  free(wws);
  return;
}

Assistant:

void jieba_word_weight_free(jieba_word_weight_t* wws) {
  jieba_word_weight_t* x = wws;
  while (x && x->word) {
    free(x->word);
    x->word = NULL;
    x++;
  }
  free(wws);
}